

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O2

void configure_char_sheet(void)

{
  int iVar1;
  wchar_t wVar2;
  ui_entry_iterator *puVar3;
  ui_entry **ppuVar4;
  ui_entry *puVar5;
  char_sheet_config *pcVar6;
  char_sheet_resist *pcVar7;
  wchar_t wVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  char *test_categories [2];
  
  release_char_sheet_config();
  cached_config = (char_sheet_config *)mem_alloc(0x88);
  test_categories[0] = "CHAR_SCREEN1";
  test_categories[1] = "stat_modifiers";
  puVar3 = initialize_ui_entry_iterator(check_for_two_categories,test_categories,"stat_modifiers");
  wVar2 = count_ui_entry_iterator(puVar3);
  wVar8 = L'\x05';
  if (wVar2 < L'\x05') {
    wVar8 = wVar2;
  }
  cached_config->n_stat_mod_entries = wVar8;
  ppuVar4 = (ui_entry **)mem_alloc((long)wVar8 * 8);
  cached_config->stat_mod_entries = ppuVar4;
  uVar13 = 0;
  uVar11 = (ulong)(uint)wVar8;
  if (wVar8 < L'\x01') {
    uVar11 = uVar13;
  }
  for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
    puVar5 = advance_ui_entry_iterator(puVar3);
    cached_config->stat_mod_entries[uVar13] = puVar5;
  }
  release_ui_entry_iterator(puVar3);
  pcVar6 = cached_config;
  cached_config->res_nlabel = L'\x06';
  pcVar6->res_cols = (uint)(player->body).count + L'\a';
  pcVar6->res_rows = L'\0';
  wVar8 = L'\0';
  iVar10 = 0;
  for (uVar11 = 0; uVar11 != 4; uVar11 = uVar11 + 1) {
    pcVar6->res_regions[uVar11].col = iVar10;
    pcVar6->res_regions[uVar11].row = 7;
    iVar9 = (uint)((uVar11 & 1) == 0) * 5 + pcVar6->res_cols;
    pcVar6->res_regions[uVar11].width = iVar9;
    test_categories[1] = (&PTR_anon_var_dwarf_1894a4_00286700)[uVar11];
    puVar3 = initialize_ui_entry_iterator
                       (check_for_two_categories,test_categories,test_categories[1]);
    wVar2 = count_ui_entry_iterator(puVar3);
    iVar1 = cached_config->res_regions[uVar11].row;
    wVar8 = L'\x14' - iVar1;
    if (wVar2 + iVar1 + 2 < 0x17) {
      wVar8 = wVar2;
    }
    cached_config->n_resist_by_region[uVar11] = wVar8;
    pcVar7 = (char_sheet_resist *)mem_alloc((long)wVar8 << 5);
    cached_config->resists_by_region[uVar11] = pcVar7;
    if (wVar8 < L'\x01') {
      wVar8 = L'\0';
    }
    for (lVar12 = 0; (ulong)(uint)wVar8 * 0x20 != lVar12; lVar12 = lVar12 + 0x20) {
      puVar5 = advance_ui_entry_iterator(puVar3);
      pcVar6 = cached_config;
      *(ui_entry **)((long)cached_config->resists_by_region[uVar11]->label + lVar12 + -8) = puVar5;
      get_ui_entry_label(puVar5,pcVar6->res_nlabel,true,
                         (wchar_t *)((long)pcVar6->resists_by_region[uVar11]->label + lVar12));
      text_mbstowcs((wchar_t *)
                    ((long)cached_config->resists_by_region[uVar11]->label + lVar12 + 0x14),":",
                    L'\x01');
    }
    release_ui_entry_iterator(puVar3);
    pcVar6 = cached_config;
    wVar2 = cached_config->n_resist_by_region[uVar11];
    wVar8 = cached_config->res_rows;
    if (cached_config->res_rows < wVar2) {
      cached_config->res_rows = wVar2;
      wVar8 = wVar2;
    }
    iVar10 = iVar10 + 1 + iVar9;
  }
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    *(wchar_t *)((long)&pcVar6->res_regions[0].page_rows + lVar12) = wVar8 + L'\x02';
  }
  return;
}

Assistant:

static void configure_char_sheet(void)
{
	const char* region_categories[] = {
		"resistances",
		"abilities",
		"modifiers",
		"hindrances"
	};
	const char* test_categories[2];
	struct ui_entry_iterator* ui_iter;
	int i, n, next_col;

	release_char_sheet_config();

	cached_config = mem_alloc(sizeof(*cached_config));

	test_categories[0] = "CHAR_SCREEN1";
	test_categories[1] = "stat_modifiers";
	ui_iter = initialize_ui_entry_iterator(check_for_two_categories,
		test_categories, test_categories[1]);
	n = count_ui_entry_iterator(ui_iter);
	/*
	 * Linked to hardcoded stats display with STAT_MAX entries so only use
	 * that many.
	 */
	if (n > STAT_MAX) {
	    n = STAT_MAX;
	}
	cached_config->n_stat_mod_entries = n;
	cached_config->stat_mod_entries = mem_alloc(n *
		sizeof(*cached_config->stat_mod_entries));
	for (i = 0; i < n; ++i) {
		cached_config->stat_mod_entries[i] =
			advance_ui_entry_iterator(ui_iter);
	}
	release_ui_entry_iterator(ui_iter);

	cached_config->res_nlabel = 6;
	cached_config->res_cols =
		cached_config->res_nlabel + 1 + player->body.count;
	cached_config->res_rows = 0;
	next_col = 0;
	for (i = 0; i < 4; ++i) {
		int j;

		//cached_config->res_regions[i].col =
		//	i * (cached_config->res_cols + 1);
		cached_config->res_regions[i].col = next_col;
		cached_config->res_regions[i].row = 2 + STAT_MAX;
		cached_config->res_regions[i].width = cached_config->res_cols
			+ ((i % 2 == 0) ? 5 : 0);
		next_col += cached_config->res_regions[i].width + 1;

		test_categories[1] = region_categories[i];
		ui_iter = initialize_ui_entry_iterator(check_for_two_categories, test_categories, region_categories[i]);
		n = count_ui_entry_iterator(ui_iter);
		/*
		 * Fit in 24 row display; leave at least one row blank before
		 * prompt on last row.
		 */
		if (n + 2 + cached_config->res_regions[i].row > 22) {
		    n = 20 - cached_config->res_regions[i].row;
		}
		cached_config->n_resist_by_region[i] = n;
		cached_config->resists_by_region[i] = mem_alloc(n * sizeof(*cached_config->resists_by_region[i]));
		for (j = 0; j < n; ++j) {
			struct ui_entry *entry = advance_ui_entry_iterator(ui_iter);

			cached_config->resists_by_region[i][j].entry = entry;
			get_ui_entry_label(entry, cached_config->res_nlabel, true, cached_config->resists_by_region[i][j].label);
			(void) text_mbstowcs(cached_config->resists_by_region[i][j].label + 5, ":", 1);
		}
		release_ui_entry_iterator(ui_iter);

		if (cached_config->res_rows <
			cached_config->n_resist_by_region[i]) {
			cached_config->res_rows =
				cached_config->n_resist_by_region[i];
		}
	}
	for (i = 0; i < 4; ++i) {
		cached_config->res_regions[i].page_rows =
			cached_config->res_rows + 2;
	}
}